

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O0

void __thiscall Gameplay::finalPhase(Gameplay *this)

{
  bool bVar1;
  ostream *poVar2;
  Stronghold *this_00;
  string *psVar3;
  pointer pPVar4;
  _Self local_40;
  _List_node_base *local_38;
  int local_2c;
  _Self _Stack_28;
  int count;
  _Self local_20;
  _List_node_base *local_18;
  Gameplay *local_10;
  Gameplay *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"FINAL PHASE");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ArrangeTurns(this);
  local_18 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_20);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Players remaining: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Player ");
    pPVar4 = std::_List_iterator<Player>::operator->(&this->it);
    this_00 = Player::getStronghold(pPVar4);
    psVar3 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pPVar4 = std::_List_iterator<Player>::operator->(&this->it);
    Player::discardSurplusFateCards(pPVar4);
    _Stack_28 = std::_List_iterator<Player>::operator++(&this->it,0);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Stats: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_2c = 1;
  local_38 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_40);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pPVar4 = std::_List_iterator<Player>::operator->(&this->it);
    Player::PrintPlayerStats(pPVar4);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_2c = local_2c + 1;
    std::_List_iterator<Player>::operator++(&this->it,0);
  }
  return;
}

Assistant:

void Gameplay::finalPhase()                                     //phase5: discarding extra hand cards and printing game stats
{
    cout << "FINAL PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout <<"Players remaining: "<<endl;
        cout << "Player " << it->getStronghold()->getName() << endl;
        it->discardSurplusFateCards();
    }

    //print game stats
    cout << "Stats: "<<endl;
    int count=1;
    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}